

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_getOwnPropertyDescriptor
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue this_obj_04;
  JSAtom JVar1;
  int iVar2;
  int iVar3;
  JSObject *in_RDX;
  undefined8 in_RSI;
  JSValueUnion in_RDI;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar4;
  int flags;
  int res;
  JSPropertyDescriptor desc;
  JSValue obj;
  JSValue ret;
  JSAtom atom;
  JSValue prop;
  undefined4 in_stack_fffffffffffffe28;
  JSAtom in_stack_fffffffffffffe2c;
  JSValueUnion in_stack_fffffffffffffe30;
  JSValueUnion in_stack_fffffffffffffe38;
  JSValueUnion in_stack_fffffffffffffe40;
  JSContext *in_stack_fffffffffffffe58;
  JSValueUnion in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  JSAtom prop_00;
  JSValueUnion in_stack_fffffffffffffe78;
  JSValueUnion in_stack_fffffffffffffe80;
  JSValueUnion in_stack_fffffffffffffe88;
  JSValueUnion in_stack_fffffffffffffe90;
  JSValueUnion in_stack_fffffffffffffe98;
  JSValueUnion local_158;
  uint uStack_144;
  JSContext *in_stack_fffffffffffffec0;
  JSValue in_stack_fffffffffffffec8;
  uint local_110;
  JSValue local_108;
  JSValue local_f8;
  JSValue local_e8;
  int local_d0;
  JSValueUnion local_c8;
  int64_t local_c0;
  JSAtom prop_01;
  long lVar7;
  undefined1 in_stack_ffffffffffffff90 [16];
  JSValue JVar5;
  JSValue JVar6;
  
  prop_00 = (JSAtom)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  prop_01 = (JSAtom)((ulong)in_RSI >> 0x20);
  if (in_R9D == 0) {
    JVar4 = JS_ToObject(in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
    local_d0 = (int)JVar4.tag;
    iVar2 = JS_IsException(JVar4);
    if (iVar2 != 0) {
      return JVar4;
    }
  }
  else {
    if ((int)in_R8->tag != -1) {
      JVar4 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x1a9712);
      return JVar4;
    }
    JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,*in_R8);
    local_d0 = (int)JVar4.tag;
  }
  JVar4.tag = in_stack_fffffffffffffe68;
  JVar4.u.float64 = in_stack_fffffffffffffe60.float64;
  JVar1 = JS_ValueToAtom(in_stack_fffffffffffffe58,JVar4);
  if (JVar1 == 0) goto LAB_001a9d24;
  local_c8.ptr = (void *)((ulong)uStack_144 << 0x20);
  local_c0 = 3;
  if (local_d0 != -1) goto LAB_001a9c9f;
  iVar2 = JS_GetOwnPropertyInternal
                    (in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_,in_RDX,prop_01)
  ;
  if (iVar2 < 0) goto LAB_001a9d24;
  if (iVar2 == 0) goto LAB_001a9c9f;
  JVar4 = JS_NewObject((JSContext *)0x1a9907);
  local_158 = JVar4.u;
  local_c8 = local_158;
  local_c0 = JVar4.tag;
  iVar2 = JS_IsException(JVar4);
  if (iVar2 == 0) {
    iVar2 = (int)JVar4.tag;
    if ((local_110 & 0x10) == 0) {
      JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,local_108);
      in_stack_fffffffffffffe78 = JVar4.u;
      in_stack_fffffffffffffe80 = (JSValueUnion)JVar4.tag;
      in_stack_fffffffffffffe28 = 0x4007;
      this_obj_01.tag = (int64_t)in_stack_fffffffffffffe98.ptr;
      this_obj_01.u.ptr = in_stack_fffffffffffffe90.ptr;
      val_01.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
      val_01.u.ptr = in_stack_fffffffffffffe80.ptr;
      iVar3 = JS_DefinePropertyValue
                        ((JSContext *)in_stack_fffffffffffffe78.ptr,this_obj_01,prop_00,val_01,iVar2
                        );
      in_stack_fffffffffffffe30 = in_RDI;
      if (-1 < iVar3) {
        prop_00 = 0;
        in_stack_fffffffffffffe28 = 0x4007;
        this_obj_02.tag = (int64_t)in_stack_fffffffffffffe98.ptr;
        this_obj_02.u.ptr = in_stack_fffffffffffffe90.ptr;
        val_02.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
        val_02.u.ptr = in_stack_fffffffffffffe80.ptr;
        iVar3 = JS_DefinePropertyValue
                          ((JSContext *)in_stack_fffffffffffffe78.ptr,this_obj_02,0,val_02,iVar2);
        in_stack_fffffffffffffe30 = in_RDI;
        goto joined_r0x001a9b56;
      }
    }
    else {
      in_stack_fffffffffffffe40 = in_RDI;
      JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,local_f8);
      in_stack_fffffffffffffe98 = JVar4.u;
      in_stack_fffffffffffffe28 = 0x4007;
      this_obj.tag = (int64_t)in_stack_fffffffffffffe98.ptr;
      this_obj.u.ptr = in_stack_fffffffffffffe90.ptr;
      val.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
      val.u.ptr = in_stack_fffffffffffffe80.ptr;
      iVar3 = JS_DefinePropertyValue
                        ((JSContext *)in_stack_fffffffffffffe78.ptr,this_obj,prop_00,val,iVar2);
      if (-1 < iVar3) {
        JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,local_e8);
        in_stack_fffffffffffffe88 = JVar4.u;
        in_stack_fffffffffffffe90 = (JSValueUnion)JVar4.tag;
        in_stack_fffffffffffffe28 = 0x4007;
        this_obj_00.tag = (int64_t)in_stack_fffffffffffffe98.ptr;
        this_obj_00.u.ptr = in_stack_fffffffffffffe90.ptr;
        val_00.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
        val_00.u.ptr = in_stack_fffffffffffffe80.ptr;
        iVar3 = JS_DefinePropertyValue
                          ((JSContext *)in_stack_fffffffffffffe78.ptr,this_obj_00,prop_00,val_00,
                           iVar2);
        in_stack_fffffffffffffe38 = in_RDI;
joined_r0x001a9b56:
        if (-1 < iVar3) {
          in_stack_fffffffffffffe28 = 0x4007;
          this_obj_03.tag = (int64_t)in_stack_fffffffffffffe98.ptr;
          this_obj_03.u.ptr = in_stack_fffffffffffffe90.ptr;
          val_03.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
          val_03.u.ptr = in_stack_fffffffffffffe80.ptr;
          iVar3 = JS_DefinePropertyValue
                            ((JSContext *)in_stack_fffffffffffffe78.ptr,this_obj_03,prop_00,val_03,
                             iVar2);
          if (-1 < iVar3) {
            in_stack_fffffffffffffe28 = 0x4007;
            this_obj_04.tag = (int64_t)in_stack_fffffffffffffe98.ptr;
            this_obj_04.u.ptr = in_stack_fffffffffffffe90.ptr;
            val_04.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
            val_04.u.ptr = in_stack_fffffffffffffe80.ptr;
            iVar2 = JS_DefinePropertyValue
                              ((JSContext *)in_stack_fffffffffffffe78.ptr,this_obj_04,prop_00,val_04
                               ,iVar2);
            if (-1 < iVar2) {
              js_free_desc((JSContext *)in_stack_fffffffffffffe30.ptr,
                           (JSPropertyDescriptor *)
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
LAB_001a9c9f:
              JS_FreeAtom((JSContext *)in_stack_fffffffffffffe30.ptr,in_stack_fffffffffffffe2c);
              v.tag = (int64_t)in_stack_fffffffffffffe40.ptr;
              v.u.ptr = in_stack_fffffffffffffe38.ptr;
              JS_FreeValue((JSContext *)in_stack_fffffffffffffe30.ptr,v);
              JVar5.tag = local_c0;
              JVar5.u.ptr = local_c8.ptr;
              return JVar5;
            }
          }
        }
      }
    }
  }
  js_free_desc((JSContext *)in_stack_fffffffffffffe30.ptr,
               (JSPropertyDescriptor *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
              );
  v_00.tag = (int64_t)in_stack_fffffffffffffe40.ptr;
  v_00.u.ptr = in_stack_fffffffffffffe38.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffe30.ptr,v_00);
LAB_001a9d24:
  lVar7 = in_stack_ffffffffffffff90._4_8_;
  JS_FreeAtom((JSContext *)in_stack_fffffffffffffe30.ptr,in_stack_fffffffffffffe2c);
  v_01.tag = (int64_t)in_stack_fffffffffffffe40.ptr;
  v_01.u.ptr = in_stack_fffffffffffffe38.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffe30.ptr,v_01);
  JVar6.u.ptr = (void *)(lVar7 << 0x20);
  JVar6.tag = 6;
  return JVar6;
}

Assistant:

static JSValue js_object_getOwnPropertyDescriptor(JSContext *ctx, JSValueConst this_val,
                                                  int argc, JSValueConst *argv, int magic)
{
    JSValueConst prop;
    JSAtom atom;
    JSValue ret, obj;
    JSPropertyDescriptor desc;
    int res, flags;

    if (magic) {
        /* Reflect.getOwnPropertyDescriptor case */
        if (JS_VALUE_GET_TAG(argv[0]) != JS_TAG_OBJECT)
            return JS_ThrowTypeErrorNotAnObject(ctx);
        obj = JS_DupValue(ctx, argv[0]);
    } else {
        obj = JS_ToObject(ctx, argv[0]);
        if (JS_IsException(obj))
            return obj;
    }
    prop = argv[1];
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        goto exception;
    ret = JS_UNDEFINED;
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        res = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(obj), atom);
        if (res < 0)
            goto exception;
        if (res) {
            ret = JS_NewObject(ctx);
            if (JS_IsException(ret))
                goto exception1;
            flags = JS_PROP_C_W_E | JS_PROP_THROW;
            if (desc.flags & JS_PROP_GETSET) {
                if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_get, JS_DupValue(ctx, desc.getter), flags) < 0
                ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_set, JS_DupValue(ctx, desc.setter), flags) < 0)
                    goto exception1;
            } else {
                if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_value, JS_DupValue(ctx, desc.value), flags) < 0
                ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_writable,
                                           JS_NewBool(ctx, (desc.flags & JS_PROP_WRITABLE) != 0), flags) < 0)
                    goto exception1;
            }
            if (JS_DefinePropertyValue(ctx, ret, JS_ATOM_enumerable,
                                       JS_NewBool(ctx, (desc.flags & JS_PROP_ENUMERABLE) != 0), flags) < 0
            ||  JS_DefinePropertyValue(ctx, ret, JS_ATOM_configurable,
                                       JS_NewBool(ctx, (desc.flags & JS_PROP_CONFIGURABLE) != 0), flags) < 0)
                goto exception1;
            js_free_desc(ctx, &desc);
        }
    }
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    return ret;

exception1:
    js_free_desc(ctx, &desc);
    JS_FreeValue(ctx, ret);
exception:
    JS_FreeAtom(ctx, atom);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}